

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O0

minisketch * minisketch_clone(minisketch *sketch)

{
  long lVar1;
  minisketch *pmVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  size_t in_stack_00000008;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000014;
  Sketch *r;
  Sketch *s;
  Sketch *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Sketch::Check(in_stack_ffffffffffffffc8);
  Sketch::Bits(in_stack_ffffffffffffffc8);
  Sketch::Implementation(in_stack_ffffffffffffffc8);
  (**(code **)(*in_RDI + 0x10))();
  pmVar2 = minisketch_create(in_stack_00000014,in_stack_00000010,in_stack_00000008);
  if (pmVar2 != (minisketch *)0x0) {
    (**(code **)(*(long *)pmVar2 + 0x38))(pmVar2,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pmVar2;
  }
  __stack_chk_fail();
}

Assistant:

minisketch* minisketch_clone(const minisketch* sketch) {
    const Sketch* s = (const Sketch*)sketch;
    s->Check();
    Sketch* r = (Sketch*) minisketch_create(s->Bits(), s->Implementation(), s->Syndromes());
    if (r) {
        r->Merge(s);
    }
    return (minisketch*) r;
}